

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O3

IXML_Node_conflict * ixmlNamedNodeMap_item(IXML_NamedNodeMap *nnMap,unsigned_long index)

{
  IXML_Node_conflict *pIVar1;
  uint uVar2;
  ulong uVar3;
  Nodeptr p_Var4;
  
  if ((nnMap != (IXML_NamedNodeMap *)0x0) &&
     (pIVar1 = nnMap->nodeItem, pIVar1 != (IXML_Node_conflict *)0x0)) {
    uVar3 = 0xffffffffffffffff;
    p_Var4 = pIVar1;
    do {
      p_Var4 = p_Var4->nextSibling;
      uVar3 = uVar3 + 1;
    } while (p_Var4 != (Nodeptr)0x0);
    if (index <= uVar3) {
      if (index == 0) {
        return pIVar1;
      }
      uVar2 = 1;
      do {
        pIVar1 = pIVar1->nextSibling;
        if (index <= uVar2) {
          return pIVar1;
        }
        uVar2 = uVar2 + 1;
      } while (pIVar1 != (IXML_Node_conflict *)0x0);
      return (IXML_Node_conflict *)0x0;
    }
  }
  return (IXML_Node_conflict *)0x0;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_item(
	/* IN */ IXML_NamedNodeMap *nnMap,
	/* IN */ unsigned long index)
{
	IXML_Node *tempNode;
	unsigned int i;

	if (nnMap == NULL) {
		return NULL;
	}

	if (index > ixmlNamedNodeMap_getLength(nnMap) - 1lu) {
		return NULL;
	}

	tempNode = nnMap->nodeItem;
	for (i = 0u; i < index && tempNode != NULL; ++i) {
		tempNode = tempNode->nextSibling;
	}

	return tempNode;
}